

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O1

LispPTR COM_setfileinfo(LispPTR *args)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  char *pcVar7;
  size_t sVar8;
  int *piVar9;
  char cVar10;
  int iVar11;
  DLword *pDVar12;
  long lVar13;
  char ver [16];
  timeval time [2];
  char host [255];
  char name [255];
  stat sbuf;
  char file [4096];
  char lfname [4101];
  char dir [4096];
  char local_3308 [16];
  timeval local_32f8;
  long local_32e8;
  undefined8 local_32e0;
  undefined4 local_32d8;
  char local_32d4;
  char local_31d8 [256];
  stat local_30d8;
  char local_3048 [4096];
  char local_2048 [4112];
  char local_1038 [4104];
  
  iVar3 = _setjmp((__jmp_buf_tag *)jmpbuf);
  iVar4 = 100;
  if (iVar3 != 0) goto LAB_0011f602;
  uVar5 = args[3];
  if ((uVar5 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar5);
  }
  Lisp_errno = (int *)(Lisp_world + uVar5);
  uVar5 = *args;
  if ((uVar5 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar5);
  }
  if ((char)Lisp_world[(ulong)uVar5 + 3] == 'D') {
    iVar3 = *(int *)(Lisp_world + (ulong)uVar5 + 4) * 2;
    iVar11 = 5;
  }
  else if ((char)Lisp_world[(ulong)uVar5 + 3] == 'C') {
    iVar3 = *(int *)(Lisp_world + (ulong)uVar5 + 4);
    iVar11 = 3;
  }
  else {
    iVar3 = error("LispStringLength: Not a character array.\n");
    iVar11 = 5;
  }
  iVar4 = 200;
  if (0x1005 < iVar3 + iVar11) goto LAB_0011f602;
  uVar5 = *args;
  if ((uVar5 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar5);
  }
  iVar4 = *(int *)(Lisp_world + (ulong)uVar5 + 4);
  iVar3 = 0x1000;
  if (iVar4 < 0x1000) {
    iVar3 = iVar4;
  }
  lVar6 = (long)iVar3;
  if ((char)Lisp_world[(ulong)uVar5 + 3] == 'D') {
    if (iVar4 == 0) {
      pcVar7 = local_2048;
    }
    else {
      lVar6 = lVar6 + (ulong)(lVar6 == 0);
      pDVar12 = Lisp_world +
                (ulong)Lisp_world[(ulong)uVar5 + 2] +
                (ulong)(*(uint *)(Lisp_world + uVar5) & 0xfffffff);
      pcVar7 = local_2048;
      do {
        *pcVar7 = *(char *)((ulong)pDVar12 ^ 2);
        pcVar7 = pcVar7 + 1;
        pDVar12 = pDVar12 + 1;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
    }
    *pcVar7 = '\0';
  }
  else if ((char)Lisp_world[(ulong)uVar5 + 3] == 'C') {
    if (iVar4 != 0) {
      uVar2 = *(uint *)(Lisp_world + uVar5);
      uVar1 = Lisp_world[(ulong)uVar5 + 2];
      lVar13 = 0;
      do {
        local_2048[lVar13] =
             *(char *)((long)Lisp_world + lVar13 + (ulong)uVar1 + (ulong)(uVar2 & 0xfffffff) * 2 ^ 3
                      );
        lVar13 = lVar13 + 1;
      } while (lVar6 + (ulong)(lVar6 == 0) != lVar13);
    }
    local_2048[lVar6] = '\0';
  }
  else {
    error("LispStringToCString: Not a character array.\n");
  }
  separate_host(local_2048,(char *)&local_32d8);
  if ((char)local_32d8 != '\0') {
    pcVar7 = (char *)((long)&local_32d8 + 1);
    cVar10 = (char)local_32d8;
    do {
      if ((byte)(cVar10 + 0x9fU) < 0x1a) {
        pcVar7[-1] = cVar10 + -0x20;
      }
      cVar10 = *pcVar7;
      pcVar7 = pcVar7 + 1;
    } while (cVar10 != '\0');
  }
  if (local_32d8 == 0x4b5344) {
    unixpathname(local_2048,local_3048,1,0);
    iVar4 = unpack_filename(local_3048,local_1038,local_31d8,local_3308,1);
    if (iVar4 == 0) {
      return 0;
    }
    iVar4 = true_name(local_1038);
    if (iVar4 != -1) {
      return 0;
    }
    iVar4 = get_version_array(local_1038,local_31d8);
    if (iVar4 == 0) {
      return 0;
    }
    strcpy(local_3048,local_31d8);
    if (local_3308[0] != '\0') {
      sVar8 = strlen(local_3048);
      (local_3048 + sVar8)[0] = '.';
      (local_3048 + sVar8)[1] = '~';
      local_3048[sVar8 + 2] = '\0';
      strcat(local_3048,local_3308);
      sVar8 = strlen(local_3048);
      (local_3048 + sVar8)[0] = '~';
      (local_3048 + sVar8)[1] = '\0';
    }
    iVar4 = get_old(local_1038,VA.files,local_3048,local_31d8);
    if (iVar4 == 0) {
      return 0;
    }
  }
  else {
    if (local_32d4 != '\0' || local_32d8 != 0x58494e55) {
      return 0;
    }
    unixpathname(local_2048,local_3048,0,0);
  }
  if (args[1] == 0xe0006) {
    uVar5 = args[2];
    if ((uVar5 & 0xfff0000) == 0xf0000) {
      uVar5 = uVar5 | 0xffff0000;
    }
    else if ((uVar5 & 0xfff0000) == 0xe0000) {
      uVar5 = uVar5 & 0xffff;
    }
    else {
      if ((uVar5 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar5);
      }
      uVar5 = *(uint *)(Lisp_world + uVar5);
    }
    alarm(TIMEOUT_TIME);
    piVar9 = __errno_location();
    do {
      *piVar9 = 0;
      iVar4 = chmod(local_3048,uVar5);
      if (iVar4 != -1) break;
      uVar5 = 0xffffffff;
    } while (*piVar9 == 4);
    alarm(0);
LAB_0011fa62:
    if (iVar4 == 0) {
      return 0x4c;
    }
  }
  else {
    if (args[1] != 0xe0002) {
      return 0;
    }
    alarm(TIMEOUT_TIME);
    piVar9 = __errno_location();
    do {
      *piVar9 = 0;
      iVar4 = stat(local_3048,&local_30d8);
      if (iVar4 != -1) break;
    } while (*piVar9 == 4);
    alarm(0);
    if (iVar4 == 0) {
      uVar5 = args[2];
      if ((uVar5 & 0xfff0000) == 0xf0000) {
        uVar5 = uVar5 | 0xffff0000;
      }
      else if ((uVar5 & 0xfff0000) == 0xe0000) {
        uVar5 = uVar5 & 0xffff;
      }
      else {
        if ((uVar5 & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar5);
        }
        uVar5 = *(uint *)(Lisp_world + uVar5);
      }
      local_32f8.tv_sec = local_30d8.st_atim.tv_sec;
      local_32f8.tv_usec = 0;
      local_32e8 = (long)(int)(uVar5 + 0xfe36b500);
      local_32e0 = 0;
      alarm(TIMEOUT_TIME);
      do {
        *piVar9 = 0;
        iVar4 = utimes(local_3048,&local_32f8);
        if (iVar4 != -1) break;
      } while (*piVar9 == 4);
      alarm(0);
      goto LAB_0011fa62;
    }
  }
  iVar4 = *piVar9;
LAB_0011f602:
  *Lisp_errno = iVar4;
  return 0;
}

Assistant:

LispPTR COM_setfileinfo(LispPTR *args)
{
  int dskp, rval, date;
  char lfname[MAXPATHLEN + 5], file[MAXPATHLEN], host[MAXNAMLEN];
  char dir[MAXPATHLEN], name[MAXNAMLEN], ver[VERSIONLEN];
  struct stat sbuf;
#ifndef DOS
  struct timeval time[2];
#else
  char drive[1], rawname[MAXNAMLEN];
  int extlen;
#endif /* DOS */

  ERRSETJMP(NIL);
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[3]);

  LispStringLength(args[0], rval, dskp);
  /*
   * Because of the version number convention, Lisp pathname might
   * be shorter than UNIX one.  For THIN string, the difference
   * is 2 bytes, for FAT string, 4 bytes.  Add 1 byte for NULL
   * terminating character.
   */
  rval = dskp ? rval + 4 + 1 : rval + 2 + 1;
  /* Add 5 for the host name field in Lisp format. */
  if (rval > MAXPATHLEN + 5) FileNameTooLong(NIL);

  LispStringToCString(args[0], lfname, MAXPATHLEN);

#ifdef DOS
  separate_host(lfname, host, drive);
#else
  separate_host(lfname, host);
#endif /* DOS */
  UPCASE(host);
  if (strcmp(host, "DSK") == 0)
    dskp = 1;
  else if (strcmp(host, "UNIX") == 0)
    dskp = 0;
  else
    return (NIL);

/*
 * Convert a Lisp file name to UNIX one.  If host is DSK, we also have to
 * convert a version field.
 */
#ifdef DOS
  unixpathname(lfname, file, dskp, 0, drive, &extlen, rawname);
#else  /* DOS */
  unixpathname(lfname, file, dskp, 0);
#endif /* DOS */

  /*
   * The file name which has been passed from Lisp is sometimes different
   * from the actual file name on DSK, even after the Lisp name is converted
   * to UNIX form with unixpathname.  The Lisp code for SETFILEINFO always
   * recognizes a file with old mode.  Thus, we recognize it again using
   * get_old routine.  It will let us know the "real accessible" name of
   * the file.
   */
  if (dskp) {
    if (unpack_filename(file, dir, name, ver, 1) == 0) return (NIL);
    if (true_name(dir) != -1) return (0);
    if (get_version_array(dir, name) == 0) return (NIL);
    ConcNameAndVersion(name, ver, file);
    if (get_old(dir, VA.files, file, name) == 0) return (NIL);
  }

  switch (args[1]) {
    case WDATE:
      TIMEOUT(rval = stat(file, &sbuf));
      if (rval != 0) {
        *Lisp_errno = errno;
        return (NIL);
      }
#ifndef DOS
      date = LispNumToCInt(args[2]);
      time[0].tv_sec = (long)sbuf.st_atime;
      time[0].tv_usec = 0L;
      time[1].tv_sec = (long)ToUnixTime(date);
      time[1].tv_usec = 0L;
      TIMEOUT(rval = utimes(file, time));
#endif /* DOS */
      if (rval != 0) {
        *Lisp_errno = errno;
        return (NIL);
      }
      return (ATOM_T);

    case PROTECTION:
      rval = LispNumToCInt(args[2]);
      TIMEOUT(rval = chmod(file, rval));
      if (rval != 0) {
        *Lisp_errno = errno;
        return (NIL);
      }
      return (ATOM_T);

    default: return (NIL);
  }
}